

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraEclipseCDT4Generator.cxx
# Opt level: O0

void __thiscall
cmExtraEclipseCDT4Generator::CreateLinksForTargets
          (cmExtraEclipseCDT4Generator *this,cmXMLWriter *xml)

{
  pointer this_00;
  undefined8 uVar1;
  bool bVar2;
  TargetType TVar3;
  vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *pvVar4;
  reference ppcVar5;
  cmMakefile *this_01;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *__x;
  reference ppcVar6;
  string *psVar7;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *__x_00;
  char *pcVar8;
  reference ppcVar9;
  cmSourceGroup *this_02;
  char *local_208;
  cmSourceGroup *sourceGroup;
  string *source;
  __normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_198;
  __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
  local_190;
  const_iterator sfIt;
  string local_180;
  string local_160;
  undefined1 local_140 [8];
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> files;
  cmGeneratorTarget *gt;
  vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> sourceGroups;
  string local_100;
  char *local_e0;
  char *prefix;
  string linkName2;
  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
  local_b0;
  const_iterator ti;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targets;
  cmMakefile *makefile;
  __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
  local_80;
  const_iterator lgIt;
  string local_70;
  allocator local_39;
  undefined1 local_38 [8];
  string linkName;
  cmXMLWriter *xml_local;
  cmExtraEclipseCDT4Generator *this_local;
  
  linkName.field_2._8_8_ = xml;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_38,"[Targets]",&local_39);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  uVar1 = linkName.field_2._8_8_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,"virtual:/virtual",(allocator *)((long)&lgIt._M_current + 7));
  AppendLinkedResource((cmXMLWriter *)uVar1,(string *)local_38,&local_70,VirtualFolder);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)((long)&lgIt._M_current + 7));
  pvVar4 = cmGlobalGenerator::GetLocalGenerators
                     ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
  local_80._M_current =
       (cmLocalGenerator **)
       std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::begin(pvVar4);
  while( true ) {
    pvVar4 = cmGlobalGenerator::GetLocalGenerators
                       ((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator);
    makefile = (cmMakefile *)
               std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::end(pvVar4);
    bVar2 = __gnu_cxx::operator!=
                      (&local_80,
                       (__normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
                        *)&makefile);
    if (!bVar2) break;
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_80);
    this_01 = cmLocalGenerator::GetMakefile(*ppcVar5);
    ppcVar5 = __gnu_cxx::
              __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
              ::operator*(&local_80);
    __x = cmLocalGenerator::GetGeneratorTargets(*ppcVar5);
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti,__x);
    local_b0._M_current =
         (cmGeneratorTarget **)
         std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::begin
                   ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    while( true ) {
      linkName2.field_2._8_8_ =
           std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::end
                     ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
      bVar2 = __gnu_cxx::operator!=
                        (&local_b0,
                         (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                          *)((long)&linkName2.field_2 + 8));
      if (!bVar2) break;
      std::__cxx11::string::string((string *)&prefix,(string *)local_38);
      std::__cxx11::string::operator+=((string *)&prefix,"/");
      ppcVar6 = __gnu_cxx::
                __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                ::operator*(&local_b0);
      TVar3 = cmGeneratorTarget::GetType(*ppcVar6);
      if (TVar3 < UTILITY) {
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_b0);
        TVar3 = cmGeneratorTarget::GetType(*ppcVar6);
        if (TVar3 == EXECUTABLE) {
          local_208 = "[exe] ";
        }
        else {
          local_208 = "[lib] ";
        }
        local_e0 = local_208;
        std::__cxx11::string::operator+=((string *)&prefix,local_208);
        ppcVar6 = __gnu_cxx::
                  __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                  ::operator*(&local_b0);
        psVar7 = cmGeneratorTarget::GetName_abi_cxx11_(*ppcVar6);
        std::__cxx11::string::operator+=((string *)&prefix,(string *)psVar7);
        uVar1 = linkName.field_2._8_8_;
        std::allocator<char>::allocator();
        std::__cxx11::string::string
                  ((string *)&local_100,"virtual:/virtual",
                   (allocator *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        AppendLinkedResource((cmXMLWriter *)uVar1,(string *)&prefix,&local_100,VirtualFolder);
        std::__cxx11::string::~string((string *)&local_100);
        std::allocator<char>::~allocator
                  ((allocator<char> *)
                   ((long)&sourceGroups.
                           super__Vector_base<cmSourceGroup,_std::allocator<cmSourceGroup>_>._M_impl
                           .super__Vector_impl_data._M_end_of_storage + 7));
        if ((this->GenerateLinkedResources & 1U) != 0) {
          __x_00 = cmMakefile::GetSourceGroups(this_01);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt,__x_00);
          ppcVar6 = __gnu_cxx::
                    __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    ::operator*(&local_b0);
          files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)*ppcVar6;
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140);
          this_00 = files.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_180,"CMAKE_BUILD_TYPE",
                     (allocator *)((long)&sfIt._M_current + 7));
          pcVar8 = cmMakefile::GetSafeDefinition(this_01,&local_180);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)&local_160,pcVar8,(allocator *)((long)&sfIt._M_current + 6));
          cmGeneratorTarget::GetSourceFiles
                    ((cmGeneratorTarget *)this_00,
                     (vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140,&local_160
                    );
          std::__cxx11::string::~string((string *)&local_160);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sfIt._M_current + 6));
          std::__cxx11::string::~string((string *)&local_180);
          std::allocator<char>::~allocator((allocator<char> *)((long)&sfIt._M_current + 7));
          local_198._M_current =
               (cmSourceFile **)
               std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::begin
                         ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140);
          __gnu_cxx::
          __normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
          ::__normal_iterator<cmSourceFile**>
                    ((__normal_iterator<cmSourceFile*const*,std::vector<cmSourceFile*,std::allocator<cmSourceFile*>>>
                      *)&local_190,&local_198);
          while( true ) {
            source = (string *)
                     std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::end
                               ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140
                               );
            bVar2 = __gnu_cxx::operator!=
                              (&local_190,
                               (__normal_iterator<cmSourceFile_**,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                                *)&source);
            if (!bVar2) break;
            ppcVar9 = __gnu_cxx::
                      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                      ::operator*(&local_190);
            cmSourceFile::GetFullPath(*ppcVar9,(string *)0x0);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            this_02 = cmMakefile::FindSourceGroup
                                (this_01,pcVar8,
                                 (vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt);
            ppcVar9 = __gnu_cxx::
                      __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                      ::operator*(&local_190);
            cmSourceGroup::AssignSource(this_02,*ppcVar9);
            __gnu_cxx::
            __normal_iterator<cmSourceFile_*const_*,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
            ::operator++(&local_190,0);
          }
          WriteGroups(this,(vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt,
                      (string *)&prefix,(cmXMLWriter *)linkName.field_2._8_8_);
          std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>::~vector
                    ((vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> *)local_140);
          std::vector<cmSourceGroup,_std::allocator<cmSourceGroup>_>::~vector
                    ((vector<cmSourceGroup,_std::allocator<cmSourceGroup>_> *)&gt);
        }
      }
      std::__cxx11::string::~string((string *)&prefix);
      __gnu_cxx::
      __normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
      ::operator++(&local_b0);
    }
    std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~vector
              ((vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> *)&ti);
    __gnu_cxx::
    __normal_iterator<cmLocalGenerator_*const_*,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>
    ::operator++(&local_80);
  }
  std::__cxx11::string::~string((string *)local_38);
  return;
}

Assistant:

void cmExtraEclipseCDT4Generator::CreateLinksForTargets(cmXMLWriter& xml)
{
  std::string linkName = "[Targets]";
  this->AppendLinkedResource(xml, linkName, "virtual:/virtual", VirtualFolder);

  for (std::vector<cmLocalGenerator*>::const_iterator lgIt =
         this->GlobalGenerator->GetLocalGenerators().begin();
       lgIt != this->GlobalGenerator->GetLocalGenerators().end(); ++lgIt) {
    cmMakefile* makefile = (*lgIt)->GetMakefile();
    const std::vector<cmGeneratorTarget*> targets =
      (*lgIt)->GetGeneratorTargets();

    for (std::vector<cmGeneratorTarget*>::const_iterator ti = targets.begin();
         ti != targets.end(); ++ti) {
      std::string linkName2 = linkName;
      linkName2 += "/";
      switch ((*ti)->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY: {
          const char* prefix =
            ((*ti)->GetType() == cmStateEnums::EXECUTABLE ? "[exe] "
                                                          : "[lib] ");
          linkName2 += prefix;
          linkName2 += (*ti)->GetName();
          this->AppendLinkedResource(xml, linkName2, "virtual:/virtual",
                                     VirtualFolder);
          if (!this->GenerateLinkedResources) {
            break; // skip generating the linked resources to the source files
          }
          std::vector<cmSourceGroup> sourceGroups =
            makefile->GetSourceGroups();
          // get the files from the source lists then add them to the groups
          cmGeneratorTarget* gt = const_cast<cmGeneratorTarget*>(*ti);
          std::vector<cmSourceFile*> files;
          gt->GetSourceFiles(files,
                             makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
          for (std::vector<cmSourceFile*>::const_iterator sfIt = files.begin();
               sfIt != files.end(); sfIt++) {
            // Add the file to the list of sources.
            std::string const& source = (*sfIt)->GetFullPath();
            cmSourceGroup* sourceGroup =
              makefile->FindSourceGroup(source.c_str(), sourceGroups);
            sourceGroup->AssignSource(*sfIt);
          }

          this->WriteGroups(sourceGroups, linkName2, xml);
        } break;
        // ignore all others:
        default:
          break;
      }
    }
  }
}